

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
cmsys::CommandLineArguments::GetUnusedArguments(CommandLineArguments *this,int *argc,char ***argv)

{
  Internal *pIVar1;
  pointer pSVar2;
  char **ppcVar3;
  char *pcVar4;
  long lVar5;
  size_type *psVar6;
  ulong uVar7;
  
  pIVar1 = this->Internals;
  pSVar2 = (pIVar1->UnusedArguments).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
           super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(pIVar1->UnusedArguments).
                super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pSVar2 >> 5;
  ppcVar3 = (char **)operator_new__(-(ulong)(uVar7 + 1 >> 0x3d != 0) | uVar7 * 8 + 8);
  pcVar4 = (char *)operator_new__((pIVar1->Argv0).super_string._M_string_length + 1);
  *ppcVar3 = pcVar4;
  strcpy(pcVar4,(pIVar1->Argv0).super_string._M_dataplus._M_p);
  psVar6 = (size_type *)((long)&pSVar2->super_string + 8);
  for (lVar5 = 1; lVar5 - 1U < uVar7; lVar5 = lVar5 + 1) {
    pcVar4 = (char *)operator_new__(*psVar6 + 1);
    ppcVar3[lVar5] = pcVar4;
    strcpy(pcVar4,(((string *)(psVar6 + -1))->_M_dataplus)._M_p);
    psVar6 = psVar6 + 4;
  }
  *argc = (int)lVar5;
  *argv = ppcVar3;
  return;
}

Assistant:

void CommandLineArguments::GetUnusedArguments(int* argc, char*** argv)
{
  CommandLineArguments::Internal::VectorOfStrings::size_type size 
    = this->Internals->UnusedArguments.size() + 1;
  CommandLineArguments::Internal::VectorOfStrings::size_type cc;

  // Copy Argv0 as the first argument
  char** args = new char*[ size ];
  args[0] = new char[ this->Internals->Argv0.size() + 1 ];
  strcpy(args[0], this->Internals->Argv0.c_str());
  int cnt = 1;

  // Copy everything after the LastArgument, since that was not parsed.
  for ( cc = 0;
    cc < this->Internals->UnusedArguments.size(); cc ++ )
    {
    kwsys::String &str = this->Internals->UnusedArguments[cc];
    args[cnt] = new char[ str.size() + 1];
    strcpy(args[cnt], str.c_str());
    cnt ++;
    }
  *argc = cnt;
  *argv = args;
}